

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_file_get_contents(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int use_include;
  jx9_io_stream *pStream;
  void *pvVar1;
  jx9_int64 jVar2;
  long lVar3;
  jx9_int64 jVar4;
  char *pcVar5;
  jx9_value *pResource;
  jx9_vm *pVm;
  long lVar6;
  char *zFile;
  int nLen;
  char zBuf [8192];
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar5 = "Expecting a file path";
  }
  else {
    zFile = jx9_value_to_string(*apArg,&nLen);
    pVm = pCtx->pVm;
    pStream = jx9VmGetStreamDevice(pVm,&zFile,nLen);
    if (pStream != (jx9_io_stream *)0x0) {
      if (nArg == 1) {
        use_include = 0;
LAB_00135ac0:
        pResource = (jx9_value *)0x0;
      }
      else {
        use_include = jx9_value_to_bool(apArg[1]);
        pVm = pCtx->pVm;
        if ((uint)nArg < 3) goto LAB_00135ac0;
        pResource = apArg[2];
      }
      pcVar5 = zFile;
      pvVar1 = jx9StreamOpenHandle(pVm,pStream,zFile,1,use_include,pResource,0,(int *)0x0);
      if (pvVar1 == (void *)0x0) {
        jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar5);
      }
      else {
        lVar3 = -1;
        if (3 < (uint)nArg) {
          jVar2 = jx9_value_to_int64(apArg[3]);
          if ((0 < jVar2) && (pStream->xSeek != (_func_int_void_ptr_jx9_int64_int *)0x0)) {
            (*pStream->xSeek)(pvVar1,jVar2,0);
          }
          if (nArg != 4) {
            lVar3 = jx9_value_to_int64(apArg[4]);
          }
        }
        jVar2 = 0x2000;
        if (lVar3 - 1U < 0x1fff) {
          jVar2 = lVar3;
        }
        lVar6 = 0;
        do {
          jVar4 = (*pStream->xRead)(pvVar1,zBuf,jVar2);
          if (jVar4 < 1) break;
          jx9_result_string(pCtx,zBuf,(int)jVar4);
          lVar6 = lVar6 + jVar4;
        } while ((lVar3 < 1) || (lVar6 < lVar3));
        if (pStream->xClose != (_func_void_void_ptr *)0x0) {
          (*pStream->xClose)(pvVar1);
        }
        if ((pCtx->pRet->sBlob).nByte != 0) {
          return 0;
        }
      }
      goto LAB_00135a3b;
    }
    pcVar5 = "No such stream device, JX9 is returning FALSE";
  }
  jx9_context_throw_error(pCtx,2,pcVar5);
LAB_00135a3b:
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_file_get_contents(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	jx9_int64 n, nRead, nMaxlen;
	int use_include  = FALSE;
	const char *zFile;
	char zBuf[8192];
	void *pHandle;
	int nLen;
	
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the file path */
	zFile = jx9_value_to_string(apArg[0], &nLen);
	/* Point to the target IO stream device */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zFile, nLen);
	if( pStream == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "No such stream device, JX9 is returning FALSE");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nMaxlen = -1;
	if( nArg > 1 ){
		use_include = jx9_value_to_bool(apArg[1]);
	}
	/* Try to open the file in read-only mode */
	pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zFile, JX9_IO_OPEN_RDONLY, use_include, nArg > 2 ? apArg[2] : 0, FALSE, 0);
	if( pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zFile);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 3 ){
		/* Extract the offset */
		n = jx9_value_to_int64(apArg[3]);
		if( n > 0 ){
			if( pStream->xSeek ){
				/* Seek to the desired offset */
				pStream->xSeek(pHandle, n, 0/*SEEK_SET*/);
			}
		}
		if( nArg > 4 ){
			/* Maximum data to read */
			nMaxlen = jx9_value_to_int64(apArg[4]);
		}
	}
	/* Perform the requested operation */
	nRead = 0;
	for(;;){
		n = pStream->xRead(pHandle, zBuf, 
			(nMaxlen > 0 && (nMaxlen < sizeof(zBuf))) ? nMaxlen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error, break immediately */
			break;
		}
		/* Append data */
		jx9_result_string(pCtx, zBuf, (int)n);
		/* Increment read counter */
		nRead += n;
		if( nMaxlen > 0 && nRead >= nMaxlen ){
			/* Read limit reached */
			break;
		}
	}
	/* Close the stream */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Check if we have read something */
	if( jx9_context_result_buf_length(pCtx) < 1 ){
		/* Nothing read, return FALSE */
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}